

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O0

void __thiscall tonk::SessionOutgoing::tonk_status(SessionOutgoing *this,TonkStatus *statusOut)

{
  uint uVar1;
  uint uVar2;
  long in_RSI;
  SenderBandwidthControl *in_RDI;
  Locker locker;
  uint lowpriQueueDepthBytes;
  uint reliableQueueDepthBytes;
  uint unreliableQueueDepthBytes;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  
  Locker::Locker((Locker *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 (Lock *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  uVar2 = *(uint *)&in_RDI[9].Deps.TimeSync;
  Locker::~Locker((Locker *)0x1e545d);
  uVar1 = SenderBandwidthControl::CalculateSendTimeMsec(in_RDI,uVar2);
  *(uint *)(in_RSI + 0xc) = uVar1;
  uVar2 = SenderBandwidthControl::CalculateSendTimeMsec(in_RDI,uVar2);
  *(uint *)(in_RSI + 0x10) = uVar2;
  *(undefined4 *)(in_RSI + 8) = *(undefined4 *)(in_RDI[5].LastIntervalStartUsec + 0x48);
  return;
}

Assistant:

void SessionOutgoing::tonk_status(TonkStatus& statusOut) const
{
    // WARNING: This function is not called on the Connection green thread,
    // so accessing members here is not threadsafe by default.

    unsigned unreliableQueueDepthBytes, reliableQueueDepthBytes, lowpriQueueDepthBytes;

    {
        Locker locker(OutgoingQueueLock);

        unreliableQueueDepthBytes = Queues[Queue_Unreliable].GetQueuedBytes();
        reliableQueueDepthBytes = Queues[Queue_Unmetered].GetQueuedBytes()
            + Queues[Queue_Reliable].GetQueuedBytes();
        lowpriQueueDepthBytes = Queues[Queue_LowPri].GetQueuedBytes();
    }

    // Reliable queue is behind unreliable queue
    reliableQueueDepthBytes += unreliableQueueDepthBytes;

    // Calculate reliable queue depth in milliseconds
    statusOut.ReliableQueueMsec = Deps.SenderControl->CalculateSendTimeMsec(
        reliableQueueDepthBytes);

    // Lowpri queue is behind reliable and unreliable queues
    lowpriQueueDepthBytes += reliableQueueDepthBytes;

    // Calculate lowpri queue depth in milliseconds
    statusOut.LowPriQueueMsec = Deps.SenderControl->CalculateSendTimeMsec(
        lowpriQueueDepthBytes);

    // Read BPS from bandwidth control
    statusOut.AppBPS = Deps.SenderControl->GetAppBPS();
}